

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cpp
# Opt level: O0

void __thiscall cppgenerate::Printer::Printer(Printer *this,Printer *other)

{
  Printer *other_local;
  Printer *this_local;
  
  std::vector<cppgenerate::Class,_std::allocator<cppgenerate::Class>_>::vector
            (&this->m_classes,&other->m_classes);
  this->m_generateAsSingleFile = (bool)(other->m_generateAsSingleFile & 1);
  std::__cxx11::string::string((string *)&this->m_outputDirectory);
  return;
}

Assistant:

Printer::Printer( const Printer& other ) :
    m_generateAsSingleFile( other.m_generateAsSingleFile ),
    m_classes( other.m_classes )
{}